

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Emu.cpp
# Opt level: O1

void __thiscall Sap_Emu::cpu_jsr(Sap_Emu *this,sap_addr_t addr)

{
  byte bVar1;
  
  (this->super_Sap_Cpu).r.pc = (uint16_t)addr;
  if (((this->super_Sap_Cpu).r.sp == 0xfe) && ((this->mem).ram[0x1ff] == 0xfe)) {
    (this->super_Sap_Cpu).r.sp = 0xff;
  }
  bVar1 = (this->super_Sap_Cpu).r.sp;
  (this->super_Sap_Cpu).r.sp = bVar1 - 1;
  (this->mem).ram[(ulong)bVar1 + 0x100] = 0xfe;
  (this->super_Sap_Cpu).r.sp = bVar1 - 2;
  (this->mem).ram[(ulong)(byte)(bVar1 - 1) + 0x100] = 0xfe;
  (this->super_Sap_Cpu).r.sp = bVar1 - 3;
  (this->mem).ram[(ulong)(byte)(bVar1 - 2) + 0x100] = 0xfe;
  return;
}

Assistant:

void Sap_Emu::cpu_jsr( sap_addr_t addr )
{
	check( r.sp >= 0xFE ); // catch anything trying to leave data on stack
	r.pc = addr;
	int high_byte = (idle_addr - 1) >> 8;
	if ( r.sp == 0xFE && mem.ram [0x1FF] == high_byte )
		r.sp = 0xFF; // pop extra byte off
	mem.ram [0x100 + r.sp--] = high_byte; // some routines use RTI to return
	mem.ram [0x100 + r.sp--] = high_byte;
	mem.ram [0x100 + r.sp--] = (idle_addr - 1) & 0xFF;
}